

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

bool __thiscall QHttpNetworkReplyPrivate::expectContent(QHttpNetworkReplyPrivate *this)

{
  int iVar1;
  Operation OVar2;
  qint64 qVar3;
  long in_RDI;
  qint64 expectedContentLength;
  int statusCode;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  iVar1 = QHttpHeaderParser::getStatusCode((QHttpHeaderParser *)(in_RDI + 0x88));
  if ((((iVar1 < 100) || (199 < iVar1)) && (iVar1 != 0xcc)) && (iVar1 != 0x130)) {
    OVar2 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)0x306a93);
    if (OVar2 == Head) {
      bVar4 = false;
    }
    else {
      qVar3 = QHttpNetworkHeaderPrivate::contentLength
                        ((QHttpNetworkHeaderPrivate *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if (qVar3 == 0) {
        bVar4 = false;
      }
      else if ((qVar3 == -1) && (*(long *)(in_RDI + 0x108) == 0)) {
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool QHttpNetworkReplyPrivate::expectContent()
{
    int statusCode = parser.getStatusCode();
    // check whether we can expect content after the headers (rfc 2616, sec4.4)
    if ((statusCode >= 100 && statusCode < 200)
        || statusCode == 204 || statusCode == 304)
        return false;
    if (request.operation() == QHttpNetworkRequest::Head)
        return false; // no body expected for HEAD request
    qint64 expectedContentLength = contentLength();
    if (expectedContentLength == 0)
        return false;
    if (expectedContentLength == -1 && bodyLength == 0) {
        // The content-length header was stripped, but its value was 0.
        // This would be the case for an explicitly zero-length compressed response.
        return false;
    }
    return true;
}